

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O2

int usedp(sexp lambda,sexp var,sexp x)

{
  int iVar1;
  long lVar2;
  anon_union_24768_35_b8e82fc1_for_value *paVar3;
  
  for (; ((ulong)x & 3) == 0; x = *(sexp *)((long)&x->tag + lVar2)) {
    lVar2 = 0x18;
    switch(x->tag) {
    case 0x1c:
      break;
    case 0x1d:
      iVar1 = usedp(lambda,var,(x->value).type.name);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = usedp(lambda,var,(x->value).type.cpl);
      if (iVar1 != 0) {
        return 1;
      }
      break;
    case 0x1e:
      if ((x->value).type.name == var) {
        return (uint)((((x->value).type.cpl)->value).type.cpl == lambda);
      }
      return 0;
    case 0x1f:
      lVar2 = 0x10;
      break;
    case 0x20:
      goto switchD_0012b8e6_caseD_20;
    case 0x21:
      paVar3 = &x->value;
      while( true ) {
        x = (paVar3->type).name;
LAB_0012b942:
        if (((ulong)x & 3) != 0) {
          return 0;
        }
        if (x->tag != 6) {
          return 0;
        }
        iVar1 = usedp(lambda,var,(x->value).type.name);
        if (iVar1 != 0) break;
        paVar3 = (anon_union_24768_35_b8e82fc1_for_value *)((long)&x->value + 8);
      }
      return 1;
    default:
      if (x->tag == 6) goto LAB_0012b942;
      goto switchD_0012b8e6_caseD_20;
    }
  }
switchD_0012b8e6_caseD_20:
  return 0;
}

Assistant:

static int usedp (sexp lambda, sexp var, sexp x) {
  sexp ls;
 loop:
  switch (sexp_pointerp(x) ? sexp_pointer_tag(x) : 0) {
  case SEXP_REF:
    return sexp_ref_name(x) == var && sexp_ref_loc(x) == lambda;
  case SEXP_SET:
    x = sexp_set_value(x);
    goto loop;
  case SEXP_LAMBDA:
    x = sexp_lambda_body(x);
    goto loop;
  case SEXP_CND:
    if (usedp(lambda, var, sexp_cnd_test(x))
        || usedp(lambda, var, sexp_cnd_pass(x)))
      return 1;
    x = sexp_cnd_fail(x);
    goto loop;
  case SEXP_SEQ:
    x = sexp_seq_ls(x);
  case SEXP_PAIR:
    for (ls=x; sexp_pairp(ls); ls=sexp_cdr(ls))
      if (usedp(lambda, var, sexp_car(ls)))
        return 1;
  }
  return 0;
}